

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t coda_strispn(char *s,char *n)

{
  int iVar1;
  int iVar2;
  char *in_RSI;
  char *in_RDI;
  char *x;
  char *p;
  char *local_20;
  char *local_18;
  
  for (local_18 = in_RDI; local_20 = in_RSI, *local_18 != '\0'; local_18 = local_18 + 1) {
    for (; *local_20 != '\0'; local_20 = local_20 + 1) {
      iVar1 = tolower((int)*local_18);
      iVar2 = tolower((int)*local_20);
      if (iVar1 == iVar2) break;
    }
    if (*local_20 == '\0') break;
  }
  return (long)local_18 - (long)in_RDI;
}

Assistant:

size_t coda_strispn(const char *s, const char *n)
{
	const char *p = s;
	const char *x;

	for (; *p; ++p)
	{
		for (x = n; *x; ++x)
		{
			if (tolower(*p) == tolower(*x)) break;
		}

		if (!*x) break;
	}

	return p - s;
}